

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_extension.cpp
# Opt level: O3

void duckdb::JemallocExtension::ThreadFlush(idx_t threshold)

{
  ulong params;
  unsigned_long result;
  string purge_arena;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)0x8;
  duckdb_je_mallctl("thread.peak.read",&local_60,(size_t *)&local_40,(void *)0x0,0);
  if (local_60._M_dataplus._M_p <= threshold) {
    duckdb_je_mallctl("thread.tcache.flush",(void *)0x0,(size_t *)0x0,(void *)0x0,0);
    local_60._M_dataplus._M_p = (pointer)0x4;
    duckdb_je_mallctl("thread.arena",&local_40,(size_t *)&local_60,(void *)0x0,0);
    params = (ulong)local_40._M_dataplus._M_p & 0xffffffff;
    local_40._M_dataplus._M_p = (char *)0x10;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_dataplus._M_p =
         (pointer)::std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_40);
    local_60.field_2._M_allocated_capacity = (size_type)local_40._M_dataplus._M_p;
    builtin_strncpy(local_60._M_dataplus._M_p,"arena.%llu.purge",0x10);
    local_60._M_string_length = (size_type)local_40._M_dataplus._M_p;
    local_60._M_dataplus._M_p[(long)local_40._M_dataplus._M_p] = '\0';
    Exception::ConstructMessage<unsigned_long>(&local_40,&local_60,params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    duckdb_je_mallctl(local_40._M_dataplus._M_p,(void *)0x0,(size_t *)0x0,(void *)0x0,0);
    duckdb_je_mallctl("thread.peak.reset",(void *)0x0,(size_t *)0x0,(void *)0x0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void JemallocExtension::ThreadFlush(idx_t threshold) {
	// We flush after exceeding the threshold
	if (GetJemallocCTL<uint64_t>("thread.peak.read") > threshold) {
		return;
	}

	// Flush thread-local cache
	SetJemallocCTL("thread.tcache.flush");

	// Flush this thread's arena
	const auto purge_arena = PurgeArenaString(idx_t(GetJemallocCTL<unsigned>("thread.arena")));
	SetJemallocCTL(purge_arena.c_str());

	// Reset the peak after resetting
	SetJemallocCTL("thread.peak.reset");
}